

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsDQJtimes(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *cvode_mem,
                N_Vector work)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  double dVar1;
  int retval;
  int iter;
  sunrealtype siginv;
  sunrealtype sig;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar2;
  char *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  long local_50;
  long local_48;
  int local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                            (CVodeMem *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            (CVLsMem *)0x11f243);
  if (local_4 == 0) {
    dVar1 = (double)N_VWrmsNorm(in_RDI,*(undefined8 *)(local_48 + 200));
    dVar1 = 1.0 / dVar1;
    for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
      N_VLinearSum(dVar1,0x3ff0000000000000,in_RDI,in_RDX,in_R9);
      local_4 = (**(code **)(local_50 + 0x110))
                          (in_XMM0_Qa,in_R9,in_RSI,*(undefined8 *)(local_48 + 0x18));
      *(long *)(local_50 + 0x90) = *(long *)(local_50 + 0x90) + 1;
      if (local_4 == 0) break;
      if (local_4 < 0) {
        return -1;
      }
      dVar1 = dVar1 * 0.25;
    }
    if (local_4 < 1) {
      N_VLinearSum(1.0 / dVar1,-(1.0 / dVar1),in_RSI,in_RCX,in_RSI);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int cvLsDQJtimes(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y,
                 N_Vector fy, void* cvode_mem, N_Vector work)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  sunrealtype sig, siginv;
  int iter, retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Initialize perturbation to 1/||v|| */
  sig = ONE / N_VWrmsNorm(v, cv_mem->cv_ewt);

  for (iter = 0; iter < MAX_DQITERS; iter++)
  {
    /* Set work = y + sig*v */
    N_VLinearSum(sig, v, ONE, y, work);

    /* Set Jv = f(tn, y+sig*v) */
    retval = cvls_mem->jt_f(t, work, Jv, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval == 0) { break; }
    if (retval < 0) { return (-1); }

    /* If f failed recoverably, shrink sig and retry */
    sig *= PT25;
  }

  /* If retval still isn't 0, return with a recoverable failure */
  if (retval > 0) { return (+1); }

  /* Replace Jv by (Jv - fy)/sig */
  siginv = ONE / sig;
  N_VLinearSum(siginv, Jv, -siginv, fy, Jv);

  return (0);
}